

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O2

Vec_Ptr_t * Ptr_AbcDeriveNode(Abc_Obj_t *pObj)

{
  Abc_NtkFunc_t AVar1;
  Abc_Obj_t *pObj_00;
  uint __line;
  int iVar2;
  Vec_Ptr_t *p;
  char *Entry;
  char *pcVar3;
  long lVar4;
  
  p = Vec_PtrAllocExact((pObj->vFanins).nSize * 2 + 4);
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
    AVar1 = pObj->pNtk->ntkFunc;
    if (AVar1 == ABC_FUNC_SOP) {
      pcVar3 = *(char **)&(pObj->field_5).iData;
      iVar2 = strcmp(pcVar3," 0\n");
      if (iVar2 == 0) {
        Entry = "BAC_BOX_C0";
      }
      else {
        iVar2 = strcmp(pcVar3," 1\n");
        if (iVar2 == 0) {
          Entry = "BAC_BOX_C1";
        }
        else {
          iVar2 = strcmp(pcVar3,"1 1\n");
          if (iVar2 == 0) {
            Entry = "BAC_BOX_BUF";
          }
          else {
            iVar2 = strcmp(pcVar3,"0 1\n");
            if (iVar2 == 0) {
              Entry = "BAC_BOX_INV";
            }
            else {
              iVar2 = strcmp(pcVar3,"11 1\n");
              if (iVar2 == 0) {
                Entry = "BAC_BOX_AND";
              }
              else {
                iVar2 = strcmp(pcVar3,"00 1\n");
                if (iVar2 == 0) {
                  Entry = "BAC_BOX_NOR";
                }
                else {
                  iVar2 = strcmp(pcVar3,"00 0\n");
                  Entry = "BAC_BOX_OR";
                  if (iVar2 != 0) {
                    iVar2 = strcmp(pcVar3,"-1 1\n1- 1\n");
                    if (iVar2 != 0) {
                      iVar2 = strcmp(pcVar3,"1- 1\n-1 1\n");
                      if (iVar2 != 0) {
                        iVar2 = strcmp(pcVar3,"01 1\n10 1\n");
                        Entry = "BAC_BOX_XOR";
                        if (iVar2 != 0) {
                          iVar2 = strcmp(pcVar3,"10 1\n01 1\n");
                          if (iVar2 != 0) {
                            iVar2 = strcmp(pcVar3,"11 1\n00 1\n");
                            Entry = "BAC_BOX_XNOR";
                            if (iVar2 != 0) {
                              iVar2 = strcmp(pcVar3,"00 1\n11 1\n");
                              if (iVar2 != 0) {
                                iVar2 = strcmp(pcVar3,"10 1\n");
                                if (iVar2 == 0) {
                                  Entry = "BAC_BOX_SHARP";
                                }
                                else {
                                  iVar2 = strcmp(pcVar3,"01 1\n");
                                  if (iVar2 != 0) {
                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bac.h"
                                                  ,0x396,"char *Ptr_SopToTypeName(char *)");
                                  }
                                  Entry = "BAC_BOX_SHARPL";
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      if (AVar1 != ABC_FUNC_AIG) {
        pcVar3 = "0";
        __line = 0x77;
        goto LAB_00320025;
      }
      Entry = Ptr_HopToType(pObj);
    }
    Vec_PtrPush(p,Entry);
    pcVar3 = Ptr_AbcObjName(pObj);
    Vec_PtrPush(p,pcVar3);
    iVar2 = (pObj->vFanins).nSize;
    if (iVar2 < 3) {
      for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar4]];
        pcVar3 = " TXr; >Xrs Yqo o!Yq oHYq oqYa 7Yq Y87q 7HYq Ya7q SoYq YqoS! oZYq YqaoZ rY r";
        if (lVar4 == 0) {
          pcVar3 = "*?BN -ke?aN ke*?1N :ek?-N ke?B1*N ak:e?-N ?Qke* ?-Qke Qke?T* ?Qe-Tk l?Qe* l";
        }
        Vec_PtrPush(p,pcVar3 + 0x4a);
        pcVar3 = Ptr_AbcObjName(pObj_00);
        Vec_PtrPush(p,pcVar3);
        iVar2 = (pObj->vFanins).nSize;
      }
      Vec_PtrPush(p,"o");
      pcVar3 = Ptr_AbcObjName(pObj);
      Vec_PtrPush(p,pcVar3);
      Ptr_CheckArray(p);
      return p;
    }
    pcVar3 = "Abc_ObjFaninNum(pObj) <= 2";
    __line = 0x79;
  }
  else {
    pcVar3 = "Abc_ObjIsNode(pObj)";
    __line = 0x72;
  }
LAB_00320025:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,__line,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNode( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; int i;
    Vec_Ptr_t * vNode = Vec_PtrAllocExact( 2 + 2 * (1 + Abc_ObjFaninNum(pObj)) );
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NtkHasAig(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_HopToType(pObj) );
    else if ( Abc_NtkHasSop(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_SopToTypeName((char *)pObj->pData) );
    else assert( 0 );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Abc_ObjFaninNum(pObj) <= 2 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        Vec_PtrPush( vNode, (void*)(i ? "r" : "l") );
        Vec_PtrPush( vNode, Ptr_AbcObjName(pFanin) );
    }
    Vec_PtrPush( vNode, (void*)("o") );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vNode) );
    return vNode;
}